

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scv.c
# Opt level: O2

void scv(void)

{
  int iVar1;
  scv_vector *psVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  scv_vector *psVar7;
  int data1_8 [5];
  int data1 [3];
  
  iVar1 = greatest_test_pre("new_objsize_zero");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(0,1);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x43;
      greatest_info.msg = "v == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_capacity_zero");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(1,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x4e;
      greatest_info.msg = "v != NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_objsize_max");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(0xffffffffffffffff,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x5b;
      greatest_info.msg = "v == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_capacity_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x66;
      greatest_info.msg = "v == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("delete_null");
  if (iVar1 == 1) {
    scv_delete((scv_vector *)0x0);
    greatest_info.msg = (char *)0x0;
    greatest_test_post(0);
  }
  iVar1 = greatest_test_pre("at_inside");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_at(psVar2,1);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != (void *)((long)psVar2->data + 4))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x81;
      greatest_info.msg = "p != NULL && p == (int *) v->data + 1";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("at_outside");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = 0;
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_at(psVar2,6);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x93;
      greatest_info.msg = "p == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("at_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = 0;
    pvVar3 = scv_at(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xa3;
      greatest_info.msg = "p == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("front_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_front(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xb7;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("front_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_front(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 199;
      greatest_info.msg = "p == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != (void *)((long)psVar2->data + 0x10))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xdb;
      greatest_info.msg = "p != NULL && p == (int *) v->data + 4";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_single");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,1);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xed;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xfd;
      greatest_info.msg = "p == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("data_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_data(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x111;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("data_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_data(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x121;
      greatest_info.msg = "p == NULL";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("empty_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_empty(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x133;
      greatest_info.msg = "res != 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("empty_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,1);
    iVar1 = scv_empty(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x145;
      greatest_info.msg = "res == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("size_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x154;
      greatest_info.msg = "v != NULL && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("size_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    scv_resize(psVar2,10);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_size(psVar2), sVar4 != 10)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x163;
      greatest_info.msg = "v != NULL && scv_size(v) == 10";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("objsize");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_objsize(psVar2), sVar4 != 3)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x172;
      greatest_info.msg = "v != NULL && scv_objsize(v) == 3";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_zero");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_reserve(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 100)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x184;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v) == 100";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_below_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x50);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x196;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_equals_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,100);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1a8;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_above_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x6e);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1ba;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_above_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x8c);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x8c)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1cc;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 140";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_capacity_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_reserve(psVar2,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1dc;
      greatest_info.msg = "res != SCV_OK";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_capacity(psVar2), sVar4 < 0x19)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1eb;
      greatest_info.msg = "v != NULL && scv_capacity(v) >= 25";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 != 0)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1fd;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v) > 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_equals_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,100);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_capacity(psVar2);
      if (sVar4 != sVar5) goto LAB_0010221f;
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
LAB_0010221f:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x20f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == scv_capacity(v)";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_below_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,0x50);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_capacity(psVar2);
      if (sVar4 != sVar5) goto LAB_001022c6;
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
LAB_001022c6:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x221;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == scv_capacity(v)";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("clear_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    iVar1 = scv_clear(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x235;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0 && scv_capacity(v) == 25";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("clear_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_clear(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x245;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0 && scv_capacity(v) == 25";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_empty_and_nonempty");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    sVar4 = scv_size(psVar2);
    if (sVar4 == 0) {
      iVar1 = scv_assign(psVar2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (((iVar1 != 0) || (sVar4 = scv_capacity(psVar2), sVar4 != 0x19)) ||
         (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x25a;
        greatest_info.msg = "res == SCV_OK && scv_capacity(v) == 25 && scv_size(v) == 0";
        goto LAB_0010250f;
      }
      iVar1 = scv_assign(psVar2,data1,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x25e;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_0010250f;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x25f;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010250f;
      }
      iVar1 = scv_assign(psVar2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x263;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
        goto LAB_0010250f;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x256;
      greatest_info.msg = "scv_size(v) == 0";
LAB_0010250f:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_less");
  if (iVar1 == 1) {
    data1[0] = -1;
    data1[1] = -1;
    data1[2] = -1;
    data1_8[0] = 0;
    data1_8[1] = 1;
    data1_8[2] = 2;
    data1_8[3] = 3;
    data1_8[4] = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_assign(psVar2,data1_8,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x279;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_00102614;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x27a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102614;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x275;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102614:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_more");
  if (iVar1 == 1) {
    data1_8[2] = -1;
    data1_8[0] = -1;
    data1_8[1] = -1;
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1_8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_assign(psVar2,data1,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x290;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_00102714;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x291;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102714;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x28c;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102714:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_null_data");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    sVar4 = scv_size(psVar2);
    if (sVar4 == 0) {
      iVar1 = scv_assign(psVar2,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x2a3;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
        goto LAB_001027df;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x29f;
      greatest_info.msg = "scv_size(v) == 0";
LAB_001027df:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_growing_capacity");
  if (iVar1 == 1) {
    data1_8[2] = -1;
    data1_8[0] = -1;
    data1_8[1] = -1;
    for (lVar6 = 0; lVar6 != 0x32; lVar6 = lVar6 + 1) {
      data1[lVar6] = (int)lVar6;
    }
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1_8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      sVar4 = scv_capacity(psVar2);
      if (sVar4 != 0x19) {
        greatest_info.fail_line = 699;
        greatest_info.msg = "scv_capacity(v) == 25";
        goto LAB_00102910;
      }
      iVar1 = scv_assign(psVar2,data1,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x2bf;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_00102910;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      sVar4 = scv_capacity(psVar2);
      if (sVar4 < 0x32) {
        greatest_info.fail_line = 0x2c0;
        greatest_info.msg = "scv_capacity(v) >= ARRAY_SIZE(data2)";
        goto LAB_00102910;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2c1;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102910;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2ba;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102910:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x2d1;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_vector");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_replace(psVar2,0,0,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2e5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102a73;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2e4;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00102a73:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_start");
  if (iVar1 == 1) {
    data1[0] = 2;
    data1[1] = 3;
    data1[2] = 4;
    data1_8[0] = 0;
    data1_8[1] = 1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,0,0,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x2fb;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00102b7c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2fc;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102b7c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2f7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102b7c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_middle");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 4;
    data1_8[0] = 2;
    data1_8[1] = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,2,2,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x312;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00102c72;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x313;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102c72;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x30e;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102c72:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_end");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    data1_8[0] = 3;
    data1_8[1] = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,3,3,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x329;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00102d73;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x32a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102d73;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x325;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102d73:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_start");
  if (iVar1 == 1) {
    data1[0] = -1;
    data1[1] = -1;
    data1[2] = 2;
    data1_8[0] = 0;
    data1_8[1] = 1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,0,2,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x340;
        goto LAB_00102e6b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x341;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102e72;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x33c;
LAB_00102e6b:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102e72:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_middle");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = -1;
    data1_8[0] = 2;
    data1_8[1] = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,2,4,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x357;
        goto LAB_00102f6b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x358;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102f72;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x353;
LAB_00102f6b:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102f72:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_end");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    data1_8[0] = 3;
    data1_8[1] = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,3,sVar4,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x36e;
        goto LAB_00103071;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x36f;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103078;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x36a;
LAB_00103071:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103078:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_start_with_nothing");
  if (iVar1 == 1) {
    data1[0] = -1;
    data1[1] = -1;
    data1[2] = 0;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_replace(psVar2,0,2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 900;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103176;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x385;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103176;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x380;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103176:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_middle_with_nothing");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = -1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_replace(psVar2,2,4,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x39a;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103275;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x39b;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103275;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x396;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103275:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_end_with_nothing");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,sVar4 - 2,sVar5,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3b0;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103388;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3b1;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103388;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3ac;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103388:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_less");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = -1;
    data1_8[0] = 2;
    data1_8[1] = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,6);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 6)) {
      iVar1 = scv_replace(psVar2,2,5,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3c7;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 5";
        goto LAB_0010348e;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3c8;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010348e;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3c3;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010348e:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_more");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = -1;
    data1_8[0] = 2;
    data1_8[1] = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,4);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 4)) {
      iVar1 = scv_replace(psVar2,2,3,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3de;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 5";
        goto LAB_0010358a;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3df;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010358a;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3da;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010358a:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_all_with_less");
  if (iVar1 == 1) {
    data1[0] = -1;
    data1[1] = -1;
    data1[2] = -1;
    data1_8[0] = 0;
    data1_8[1] = 1;
    data1_8[2] = 2;
    data1_8[3] = 3;
    data1_8[4] = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,data1_8,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3f5;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_0010369d;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3f6;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010369d;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3f1;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010369d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_all_with_more");
  if (iVar1 == 1) {
    data1_8[2] = -1;
    data1_8[0] = -1;
    data1_8[1] = -1;
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1_8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,data1,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x40c;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_001037ab;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x40d;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001037ab;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x408;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001037ab:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_null_data");
  if (iVar1 == 1) {
    data1[2] = -1;
    data1[0] = -1;
    data1[1] = -1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x422;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
        goto LAB_0010388c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x41e;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010388c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_growing_capacity");
  if (iVar1 == 1) {
    data1_8[0] = 0x2d;
    data1_8[1] = 0x2e;
    data1_8[2] = 0x2f;
    data1_8[3] = 0x30;
    data1_8[4] = 0x31;
    for (lVar6 = 0; lVar6 != 0x2d; lVar6 = lVar6 + 1) {
      data1[lVar6] = (int)lVar6;
    }
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1_8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,0,0,data1,0x2d);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x43d;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00103995;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x43e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103995;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x439;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103995:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_replace(psVar2,0,0,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x44e;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_outside_range");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,2,sVar4 + 1,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x463;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00103b34;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x464;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103b34;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x45f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103b34:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_negative_range");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,3,2,(void *)0x0,1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x479;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00103c30;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x47a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103c30;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x475;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103c30:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_empty_vector");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x48e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103cfa;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x48d;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103cfa:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_start");
  if (iVar1 == 1) {
    data1[0] = 2;
    data1[1] = 3;
    data1[2] = 4;
    data1_8[0] = 0;
    data1_8[1] = 1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,0,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4a4;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00103dee;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4a5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103dee;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4a0;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103dee:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_middle");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 4;
    data1_8[0] = 2;
    data1_8[1] = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,2,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4bb;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00103ee3;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4bc;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103ee3;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4b7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103ee3:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_end");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    data1_8[0] = 3;
    data1_8[1] = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4,data1_8,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4d2;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00103fe0;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4d3;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103fe0;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4ce;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103fe0:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_nothing");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_insert(psVar2,0,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4e8;
        goto LAB_0010416b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4e9;
LAB_00106267:
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104172;
      }
      iVar1 = scv_insert(psVar2,2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4ed;
        goto LAB_0010416b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4ee;
        goto LAB_00106267;
      }
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4f2;
        goto LAB_0010416b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4f3;
        goto LAB_00106267;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4e4;
LAB_0010416b:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104172:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_null_data");
  if (iVar1 == 1) {
    data1[2] = -1;
    data1[0] = -1;
    data1[1] = -1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,0,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x35)) {
        greatest_info.fail_line = 0x508;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) + 50";
        goto LAB_00104249;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x504;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104249:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_growing_capacity");
  if (iVar1 == 1) {
    data1_8[0] = 0x2d;
    data1_8[1] = 0x2e;
    data1_8[2] = 0x2f;
    data1_8[3] = 0x30;
    data1_8[4] = 0x31;
    for (lVar6 = 0; lVar6 != 0x2d; lVar6 = lVar6 + 1) {
      data1[lVar6] = (int)lVar6;
    }
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1_8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_insert(psVar2,0,data1,0x2d);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x523;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00104351;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x524;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104351;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x51f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00104351:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x534;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_outside_range");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4 + 1,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x549;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_001044eb;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x54a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001044eb;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x545;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_001044eb:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_nothing");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_erase(psVar2,0,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_resize(psVar2,10);
      iVar1 = scv_erase(psVar2,0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 10)) {
        greatest_info.fail_line = 0x562;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 10";
        goto LAB_0010456c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x55c;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
LAB_0010456c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_start");
  if (iVar1 == 1) {
    data1[0] = -1;
    data1[1] = -1;
    data1[2] = 0;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_erase(psVar2,0,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x577;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00104665;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x578;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104665;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x573;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104665:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_middle");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = -1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_erase(psVar2,2,4);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x58d;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_0010475f;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x58e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010475f;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x589;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010475f:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_end");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,sVar4 - 2,sVar5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5a3;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_0010486d;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5a4;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010486d;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x59f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010486d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_all");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,0,sVar4);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x5b9;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
        goto LAB_0010495c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5b5;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010495c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_outside_range");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,2,sVar4 + 1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5ce;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00104a5b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5cf;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104a5b;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5ca;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104a5b:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_negative_range");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_erase(psVar2,3,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5e4;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00104b51;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5e5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104b51;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5e0;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104b51:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back_empty");
  if (iVar1 == 1) {
    data1._0_8_ = data1._0_8_ & 0xffffffff00000000;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_push_back(psVar2,data1);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 1)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5f9;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104c05;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5f8;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 1";
LAB_00104c05:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    data1_8[0] = 5;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_push_back(psVar2,data1_8);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 6)) {
        greatest_info.fail_line = 0x60f;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) + 1";
        goto LAB_00104cff;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x610;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104cff;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x60b;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104cff:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back_growing_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = 0;
    while( true ) {
      data1[0] = iVar1;
      if (0x1d < iVar1) break;
      iVar1 = scv_push_back(psVar2,data1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar1 != 0) {
LAB_00104d92:
        greatest_info.fail_line = 0x621;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == (size_t) i + 1";
LAB_00104de6:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
        if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
        iVar1 = -1;
        goto LAB_00104dfd;
      }
      sVar4 = scv_size(psVar2);
      if (sVar4 != (long)data1[0] + 1U) goto LAB_00104d92;
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x622;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104de6;
      }
      iVar1 = data1[0] + 1;
    }
    scv_delete(psVar2);
    greatest_info.msg = (char *)0x0;
    iVar1 = 0;
LAB_00104dfd:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pop_back");
  if (iVar1 == 1) {
    data1[0] = 0;
    data1[1] = 1;
    data1[2] = 2;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,data1,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_pop_back(psVar2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 4)) {
        greatest_info.fail_line = 0x63a;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 1";
        goto LAB_00104ed6;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x63b;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104ed6;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x636;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104ed6:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pop_back_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_pop_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x64b;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_zero_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x65f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_smaller_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x671;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 25";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_equal_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x32);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x32)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x683;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_larger_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x4b);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x4b)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x695;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 75";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_larger_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x7d);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x7d)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6a7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 125";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_size_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_resize(psVar2,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6b7;
      greatest_info.msg = "res != SCV_OK";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_empty_to_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6cb;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_empty_to_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar2,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6e0;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar7,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6f5;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 5";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar2,0,(void *)0x0,10);
    scv_insert(psVar7,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x70b;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 5";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_objsize_mismatch");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(2,0x32);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x71e;
      greatest_info.msg = "res != SCV_OK";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_to_itself");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_copy(psVar2,psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x72f;
      greatest_info.msg = "res != SCV_OK";
      if ((greatest_info.flags & 4) != 0) goto LAB_00106425;
      iVar1 = -1;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("swap");
  if (iVar1 != 1) {
    return;
  }
  psVar2 = scv_new(1,100);
  psVar7 = scv_new(4,0x19);
  iVar1 = scv_swap(psVar2,psVar7);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
     (sVar4 = scv_capacity(psVar7), sVar4 == 100)) {
    scv_delete(psVar2);
    scv_delete(psVar7);
    greatest_info.msg = (char *)0x0;
    iVar1 = 0;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
    greatest_info.fail_line = 0x743;
    greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_capacity(v2) == 100";
    if ((greatest_info.flags & 4) != 0) {
LAB_00106425:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      abort();
    }
    iVar1 = -1;
  }
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(scv)
{
	RUN_TEST(new_objsize_zero);
	RUN_TEST(new_capacity_zero);
	RUN_TEST(new_objsize_max);
	RUN_TEST(new_capacity_max);

	RUN_TEST(delete_null);

	RUN_TEST(at_inside);
	RUN_TEST(at_outside);
	RUN_TEST(at_empty);

	RUN_TEST(front_nonempty);
	RUN_TEST(front_empty);

	RUN_TEST(back_nonempty);
	RUN_TEST(back_single);
	RUN_TEST(back_empty);

	RUN_TEST(data_nonempty);
	RUN_TEST(data_empty);

	RUN_TEST(empty_empty);
	RUN_TEST(empty_nonempty);

	RUN_TEST(size_empty);
	RUN_TEST(size_nonempty);

	RUN_TEST(objsize);

	RUN_TEST(reserve_zero);
	RUN_TEST(reserve_below_size);
	RUN_TEST(reserve_equals_size);
	RUN_TEST(reserve_above_size);
	RUN_TEST(reserve_above_capacity);
	RUN_TEST(reserve_capacity_max);

	RUN_TEST(capacity);

	RUN_TEST(shrink_to_fit_empty);
	RUN_TEST(shrink_to_fit_size_equals_capacity);
	RUN_TEST(shrink_to_fit_size_below_capacity);

	RUN_TEST(clear_nonempty);
	RUN_TEST(clear_empty);

	RUN_TEST(assign_empty_and_nonempty);
	RUN_TEST(assign_less);
	RUN_TEST(assign_more);
	RUN_TEST(assign_null_data);
	RUN_TEST(assign_growing_capacity);
	RUN_TEST(assign_nobj_max);

	RUN_TEST(replace_empty_vector);
	RUN_TEST(replace_empty_range_start);
	RUN_TEST(replace_empty_range_middle);
	RUN_TEST(replace_empty_range_end);
	RUN_TEST(replace_start);
	RUN_TEST(replace_middle);
	RUN_TEST(replace_end);
	RUN_TEST(replace_start_with_nothing);
	RUN_TEST(replace_middle_with_nothing);
	RUN_TEST(replace_end_with_nothing);
	RUN_TEST(replace_with_less);
	RUN_TEST(replace_with_more);
	RUN_TEST(replace_all_with_less);
	RUN_TEST(replace_all_with_more);
	RUN_TEST(replace_with_null_data);
	RUN_TEST(replace_growing_capacity);
	RUN_TEST(replace_nobj_max);
	RUN_TEST(replace_outside_range);
	RUN_TEST(replace_negative_range);

	RUN_TEST(insert_empty_vector);
	RUN_TEST(insert_start);
	RUN_TEST(insert_middle);
	RUN_TEST(insert_end);
	RUN_TEST(insert_nothing);
	RUN_TEST(insert_null_data);
	RUN_TEST(insert_growing_capacity);
	RUN_TEST(insert_nobj_max);
	RUN_TEST(insert_outside_range);

	RUN_TEST(erase_nothing);
	RUN_TEST(erase_start);
	RUN_TEST(erase_middle);
	RUN_TEST(erase_end);
	RUN_TEST(erase_all);
	RUN_TEST(erase_outside_range);
	RUN_TEST(erase_negative_range);

	RUN_TEST(push_back_empty);
	RUN_TEST(push_back);
	RUN_TEST(push_back_growing_capacity);

	RUN_TEST(pop_back);
	RUN_TEST(pop_back_empty);

	RUN_TEST(resize_zero_size);
	RUN_TEST(resize_smaller_size);
	RUN_TEST(resize_equal_size);
	RUN_TEST(resize_larger_size);
	RUN_TEST(resize_larger_capacity);
	RUN_TEST(resize_size_max);

	RUN_TEST(copy_empty_to_empty);
	RUN_TEST(copy_empty_to_nonempty);
	RUN_TEST(copy_nonempty_to_empty);
	RUN_TEST(copy_nonempty_to_nonempty);
	RUN_TEST(copy_objsize_mismatch);
	RUN_TEST(copy_to_itself);

	RUN_TEST(swap);
}